

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream aoStack_1c8 [112];
  ios_base local_158 [264];
  FormatArg *local_50;
  undefined4 local_48;
  FormatArg local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(aoStack_1c8);
  local_50 = &local_40;
  local_48 = 1;
  local_40.m_formatImpl =
       detail::FormatArg::formatImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_40.m_toIntImpl =
       detail::FormatArg::toIntImpl<std::basic_string_view<char,std::char_traits<char>>>;
  local_40.m_value = fmt;
  detail::formatImpl((ostream *)aoStack_1c8,(char *)this,local_50,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1c8);
  std::ios_base::~ios_base(local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}